

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# talg.c
# Opt level: O0

int downsample(double *x,int lenx,int M,double *y)

{
  int local_30;
  int i;
  int N;
  double *y_local;
  int M_local;
  int lenx_local;
  double *x_local;
  
  if (M < 0) {
    x_local._4_4_ = -1;
  }
  else if (M == 0) {
    for (local_30 = 0; x_local._4_4_ = lenx, local_30 < lenx; local_30 = local_30 + 1) {
      y[local_30] = x[local_30];
    }
  }
  else {
    x_local._4_4_ = (lenx + -1) / M + 1;
    for (local_30 = 0; local_30 < x_local._4_4_; local_30 = local_30 + 1) {
      y[local_30] = x[local_30 * M];
    }
  }
  return x_local._4_4_;
}

Assistant:

int downsample(double *x,int lenx, int M, double *y) {
	int N,i;

	if (M < 0) {
		return -1;
	}
	if (M == 0) {
		for (i = 0; i < lenx; ++i) {
			y[i] = x[i];
		}
		return lenx;
	}

	N = (lenx-1)/M + 1;

	for (i = 0;i < N;++i) {
		y[i] = x[i*M];
	}

	return N;
}